

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_get_keyimage(secp256k1_context *ctx,uint8_t *ki,uint8_t *pk,uint8_t *sk)

{
  int iVar1;
  size_t clen;
  int overflow;
  secp256k1_gej gej2;
  secp256k1_gej gej1;
  secp256k1_scalar zero;
  secp256k1_scalar s;
  secp256k1_ge ge1;
  secp256k1_scalar *in_stack_00000a60;
  secp256k1_scalar *in_stack_00000a68;
  secp256k1_gej *in_stack_00000a70;
  secp256k1_gej *in_stack_00000a78;
  secp256k1_ecmult_context *in_stack_00000a80;
  secp256k1_ge *in_stack_fffffffffffffe28;
  secp256k1_gej *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe3c;
  secp256k1_scalar *in_stack_fffffffffffffe40;
  secp256k1_gej *in_stack_fffffffffffffe78;
  secp256k1_ge *in_stack_fffffffffffffe80;
  size_t in_stack_fffffffffffffee8;
  uint8_t *in_stack_fffffffffffffef0;
  secp256k1_ge *in_stack_fffffffffffffef8;
  secp256k1_scalar local_c0;
  secp256k1_scalar local_a0 [4];
  int local_4;
  
  secp256k1_scalar_set_int(&local_c0,0);
  iVar1 = hash_to_curve(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                        in_stack_fffffffffffffee8);
  if (iVar1 == 0) {
    secp256k1_scalar_set_b32
              (in_stack_fffffffffffffe40,
               (uchar *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
               (int *)in_stack_fffffffffffffe30);
    if ((in_stack_fffffffffffffe3c == 0) && (iVar1 = secp256k1_scalar_is_zero(local_a0), iVar1 == 0)
       ) {
      secp256k1_gej_set_ge(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
      secp256k1_ecmult(in_stack_00000a80,in_stack_00000a78,in_stack_00000a70,in_stack_00000a68,
                       in_stack_00000a60);
      secp256k1_ge_set_gej(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      secp256k1_eckey_pubkey_serialize
                ((secp256k1_ge *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                 (uchar *)in_stack_fffffffffffffe30,(size_t *)in_stack_fffffffffffffe28,0);
      local_4 = 3;
      if (in_stack_fffffffffffffe30 == (secp256k1_gej *)0x21) {
        local_4 = 0;
      }
    }
    else {
      local_4 = 2;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int secp256k1_get_keyimage(const secp256k1_context *ctx, uint8_t *ki, const uint8_t *pk, const uint8_t *sk)
{
    secp256k1_ge ge1;
    secp256k1_scalar s, zero;
    secp256k1_gej gej1, gej2;
    int overflow;
    size_t clen;

    secp256k1_scalar_set_int(&zero, 0);

    if (0 != hash_to_curve(&ge1, pk, 33)) { /* H(pk) */
        return 1;
    }

    secp256k1_scalar_set_b32(&s, sk, &overflow);
    if (overflow || secp256k1_scalar_is_zero(&s)) {
        return 2;
    }

    secp256k1_gej_set_ge(&gej1, &ge1);
    secp256k1_ecmult(&ctx->ecmult_ctx, &gej2, &gej1, &s, &zero);  /* gej2 = H(pk) * sk */
    secp256k1_ge_set_gej(&ge1, &gej2);
    secp256k1_eckey_pubkey_serialize(&ge1, ki, &clen, 1);

    return (clen == 33) ? 0 : 3;
}